

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O2

int arkLSGetNumMassConvFails(void *arkode_mem,long *nmcfails)

{
  int iVar1;
  ARKLsMassMem arkls_mem;
  ARKodeMem ark_mem;
  ARKLsMassMem local_18;
  ARKodeMem local_10;
  
  iVar1 = arkLs_AccessMassMem(arkode_mem,"arkLSGetNumMassConvFails",&local_10,&local_18);
  if (iVar1 == 0) {
    *nmcfails = local_18->ncfl;
  }
  return iVar1;
}

Assistant:

int arkLSGetNumMassConvFails(void *arkode_mem, long int *nmcfails)
{
  ARKodeMem    ark_mem;
  ARKLsMassMem arkls_mem;
  int          retval;

  /* access ARKLsMassMem structure; set output value and return */
  retval = arkLs_AccessMassMem(arkode_mem, "arkLSGetNumMassConvFails",
                               &ark_mem, &arkls_mem);
  if (retval != ARK_SUCCESS)  return(retval);
  *nmcfails = arkls_mem->ncfl;
  return(ARKLS_SUCCESS);
}